

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_throw::statement_throw
          (statement_throw *this,tree_type<cs::token_base_*> *tree,context_t *c,token_base *ptr)

{
  shared_ptr<cs::context_type> *in_RDX;
  context_t *in_RSI;
  token_base *in_RDI;
  statement_base *in_stack_ffffffffffffffd0;
  
  std::shared_ptr<cs::context_type>::shared_ptr((shared_ptr<cs::context_type> *)in_RDI,in_RDX);
  statement_base::statement_base(in_stack_ffffffffffffffd0,in_RSI,in_RDI);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x243ada);
  in_RDI->_vptr_token_base = (_func_int **)&PTR__statement_throw_003be810;
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_RDI,(tree_type<cs::token_base_*> *)in_RDX);
  return;
}

Assistant:

statement_throw(tree_type<token_base *> tree, context_t c, token_base *ptr) : statement_base(std::move(c), ptr),
			mTree(std::move(tree)) {}